

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmitBuffer.cpp
# Opt level: O3

bool __thiscall
EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_CriticalSection>
::FinalizeAllocation
          (EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_CriticalSection>
           *this,TEmitBufferAllocation *allocation,BYTE *dstBuffer)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  undefined4 *puVar4;
  DWORD alignPad;
  ulong uVar5;
  BYTE *local_40;
  BYTE *buffer;
  
  bVar2 = CCLock::IsLocked(&(this->criticalSection).super_CCLock);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EmitBuffer.cpp"
                       ,300,"(this->criticalSection.IsLocked())","this->criticalSection.IsLocked()")
    ;
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  uVar5 = allocation->bytesCommitted - allocation->bytesUsed;
  bVar2 = true;
  alignPad = (DWORD)uVar5;
  if (alignPad != 0) {
    local_40 = (BYTE *)0x0;
    uVar5 = uVar5 & 0xffffffff;
    buffer = dstBuffer;
    GetBuffer(this,allocation,uVar5,&local_40);
    bVar3 = CommitBuffer(this,allocation,allocation->bytesCommitted,buffer,0,(BYTE *)0x0,alignPad);
    if (bVar3) {
      this->totalBytesCode = this->totalBytesCode - uVar5;
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool EmitBufferManager<TAlloc, TPreReservedAlloc, SyncObject>::FinalizeAllocation(TEmitBufferAllocation *allocation, BYTE * dstBuffer)
{
    Assert(this->criticalSection.IsLocked());

    DWORD bytes = allocation->BytesFree();
    if(bytes > 0)
    {
        BYTE* buffer = nullptr;
        this->GetBuffer(allocation, bytes, &buffer);
        if (!this->CommitBuffer(allocation, allocation->bytesCommitted, dstBuffer, 0, /*sourceBuffer=*/ nullptr, /*alignPad=*/ bytes))
        {
            return false;
        }

#if DBG_DUMP
        this->totalBytesCode -= bytes;
#endif
    }

    return true;
}